

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<double> fmt::v8::detail::dragonbox::to_decimal<double>(double x)

{
  carrier_uint two_f;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  carrier_uint two_f_00;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  int iVar13;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  char cVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  decimal_fp<double> dVar23;
  cache_entry_type cache;
  
  uVar15 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) == 0) {
    uVar22 = 0xfffffbce;
    if (uVar15 == 0) {
      uVar21 = 0;
      uVar19 = 0;
      goto LAB_001353ed;
    }
LAB_0013500a:
    uVar10 = (int)(uVar22 * 0x134413) >> 0x16;
    uVar21 = (ulong)uVar10;
    iVar13 = uVar10 - 2;
    cache.internal_._0_8_ = cache_accessor<double>::get_cached_power(2 - uVar10);
    iVar20 = ((int)((2 - uVar10) * 0x1a934f) >> 0x13) + uVar22;
    two_f_00 = uVar15 * 2;
    two_f = uVar15 * 2 + 1;
    uVar19 = two_f << ((byte)iVar20 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar19;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = extraout_RDX;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (uint128_wrapper *)cache.internal_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar19;
    uVar18 = SUB168(auVar4 * auVar7,8) +
             (ulong)CARRY8(SUB168(auVar5 * auVar8,8),SUB168(auVar4 * auVar7,0));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar18;
    uVar19 = SUB168(auVar6 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
    uVar16 = (int)uVar18 + (int)uVar19 * -1000;
    uVar11 = (uint)(extraout_RDX >> (~(byte)iVar20 & 0x3f));
    if (uVar11 < uVar16) {
LAB_001352ed:
      iVar17 = uVar16 - (uVar11 >> 1);
      uVar10 = iVar17 + 0x32;
      if ((uVar10 & 3) == 0) {
        uVar10 = (uVar10 >> 2) * 0xa429;
        uVar19 = uVar19 * 10 + (ulong)(uVar10 >> 0x14);
        if ((uVar10 & 0xff) < 0xb) {
          bVar9 = cache_accessor<double>::compute_mul_parity(two_f_00,&cache,iVar20);
          if (bVar9 == (bool)((byte)iVar17 & 1)) {
            bVar9 = is_center_integer<double>(two_f_00,uVar22,iVar13);
            if (bVar9) {
              uVar19 = uVar19 & 0xfffffffffffffffe;
            }
          }
          else {
            uVar19 = uVar19 - 1;
          }
        }
      }
      else {
        uVar19 = uVar19 * 10 + (ulong)(uVar10 * 0xa3d8 >> 0x16);
      }
      goto LAB_001353ed;
    }
    if (uVar16 < uVar11) {
      if (((uVar16 == 0) && ((uVar15 & 1) != 0)) &&
         (bVar9 = is_endpoint_integer<double>(two_f,uVar22,iVar13), bVar9)) {
        uVar19 = uVar19 - 1;
        uVar16 = 1000;
        goto LAB_001352ed;
      }
    }
    else if ((((uVar15 & 1) != 0) ||
             (bVar9 = is_endpoint_integer<double>(two_f_00 - 1,uVar22,iVar13), !bVar9)) &&
            (bVar9 = cache_accessor<double>::compute_mul_parity(two_f_00 - 1,&cache,iVar20), !bVar9)
            ) goto LAB_001352ed;
    iVar13 = uVar10 + 1;
    uVar15 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
      }
    }
    uVar22 = (uint)uVar15;
    uVar21 = 0x10;
    if (uVar22 < 0x10) {
      uVar21 = uVar15;
    }
    if (uVar15 < 8) {
      if (uVar15 == 0) goto LAB_001353bb;
    }
    else if (uVar19 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
      iVar20 = 8;
      uVar22 = (uint)(uVar19 * -0x3898f8b4dd16f1df >> 8);
      while ((iVar17 = (int)uVar21, (int)uVar21 != iVar20 &&
             (iVar17 = iVar20, uVar22 * -0x33333333 < 0x33333334))) {
        iVar20 = iVar20 + 1;
        uVar22 = uVar22 * -0x33333333;
      }
LAB_001353c1:
      uVar19 = (ulong)(uVar22 >> ((char)iVar17 - 8U & 0x1f));
      goto LAB_001353c7;
    }
    iVar17 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar19;
    uVar15 = SUB168(auVar2 / ZEXT816(100000000),0);
    iVar20 = (int)uVar19 + SUB164(auVar2 / ZEXT816(100000000),0) * -100000000;
    uVar10 = iVar20 * -0x33333333;
    if (uVar10 < 0x33333334) {
      if ((uVar22 == 1) || (0x33333333 < (uint)(iVar20 * -0x3d70a3d7))) {
LAB_001353ac:
        uVar19 = uVar15 * 10000000 + (ulong)(uVar10 >> 1);
        iVar17 = 1;
      }
      else if ((uVar22 == 2) || (uVar10 = iVar20 * 0x26e978d5, 0x33333333 < uVar10)) {
        uVar19 = uVar15 * 1000000 + (ulong)((uint)(iVar20 * -0x3d70a3d7) >> 2);
        iVar17 = 2;
      }
      else if ((uVar22 == 3) || (uVar16 = iVar20 * 0x3afb7e91, 0x33333333 < uVar16)) {
LAB_00135484:
        uVar19 = uVar15 * 100000 + (ulong)(uVar10 >> 3);
        iVar17 = 3;
      }
      else if ((uVar22 == 4) || (uVar10 = iVar20 * 0xbcbe61d, 0x33333333 < uVar10)) {
LAB_001354c5:
        uVar19 = uVar15 * 10000 + (ulong)(uVar16 >> 4);
        iVar17 = 4;
      }
      else if ((uVar22 == 5) || (uVar16 = iVar20 * 0x68c26139, 0x33333333 < uVar16)) {
LAB_00135506:
        uVar19 = uVar15 * 1000 + (ulong)(uVar10 >> 5);
        iVar17 = 5;
      }
      else if ((uVar22 == 6) || (uVar22 = iVar20 * -0x5172b95b, 0x33333333 < uVar22)) {
LAB_00135547:
        uVar19 = uVar15 * 100 + (ulong)(uVar16 >> 6);
        iVar17 = 6;
      }
      else {
LAB_0013555f:
        uVar19 = uVar15 * 10 + (ulong)(uVar22 >> 7);
        iVar17 = 7;
      }
    }
  }
  else {
    uVar22 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar15 != 0) {
      uVar15 = uVar15 + 0x10000000000000;
      goto LAB_0013500a;
    }
    uVar10 = (int)(uVar22 * 0x134413 + -0x7feff) >> 0x16;
    uVar21 = (ulong)uVar10;
    cVar14 = (char)((int)(uVar10 * -0x1a934f) >> 0x13) + (char)uVar22;
    cache_accessor<double>::get_cached_power(-uVar10);
    bVar12 = 0xb - cVar14;
    uVar15 = (extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar12 & 0x3f);
    uVar18 = (ulong)((uVar22 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar12 & 0x3f));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar15;
    uVar19 = SUB168(auVar1 / ZEXT816(10),0);
    if (uVar19 * 10 < uVar18) {
      uVar15 = (extraout_RDX_00 >> (10U - cVar14 & 0x3f)) + 1 >> 1;
      if (uVar22 == 0xffffffb3) {
        uVar19 = uVar15 & 0xfffffffffffffffe;
      }
      else {
        uVar19 = uVar15 + (uVar15 < uVar18);
      }
      goto LAB_001353ed;
    }
    iVar13 = uVar10 + 1;
    uVar21 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    uVar22 = (uint)uVar21;
    uVar18 = 0x10;
    if (uVar22 < 0x10) {
      uVar18 = uVar21;
    }
    if (7 < uVar21) {
      if (uVar19 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
        iVar20 = 8;
        uVar22 = (uint)(uVar19 * -0x3898f8b4dd16f1df >> 8);
        while ((iVar17 = (int)uVar18, (int)uVar18 != iVar20 &&
               (iVar17 = iVar20, uVar22 * -0x33333333 < 0x33333334))) {
          iVar20 = iVar20 + 1;
          uVar22 = uVar22 * -0x33333333;
        }
        goto LAB_001353c1;
      }
LAB_00135366:
      iVar17 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar15;
      uVar11 = SUB164(auVar3 / ZEXT816(1000000000),0);
      iVar20 = uVar11 * -100000000 + SUB164(auVar1 / ZEXT816(10),0);
      uVar10 = iVar20 * -0x33333333;
      if (0x33333333 < uVar10) goto LAB_001353c7;
      if ((uVar22 != 1) && ((uint)(iVar20 * -0x3d70a3d7) < 0x33333334)) {
        if ((uVar22 == 2) || (uVar10 = iVar20 * 0x26e978d5, 0x33333333 < uVar10)) {
          iVar17 = 2;
          uVar19 = (ulong)uVar11 * 1000000 + (ulong)((uint)(iVar20 * -0x3d70a3d7) >> 2);
          goto LAB_001353c7;
        }
        if ((uVar22 != 3) && (uVar16 = iVar20 * 0x3afb7e91, uVar16 < 0x33333334)) {
          if ((uVar22 != 4) && (uVar10 = iVar20 * 0xbcbe61d, uVar10 < 0x33333334)) {
            if ((uVar22 != 5) && (uVar16 = iVar20 * 0x68c26139, uVar16 < 0x33333334)) {
              if ((uVar22 != 6) && (uVar22 = iVar20 * -0x5172b95b, uVar22 < 0x33333334)) {
                uVar15 = (ulong)uVar11;
                goto LAB_0013555f;
              }
              uVar15 = (ulong)uVar11;
              goto LAB_00135547;
            }
            uVar15 = (ulong)uVar11;
            goto LAB_00135506;
          }
          uVar15 = (ulong)uVar11;
          goto LAB_001354c5;
        }
        uVar15 = (ulong)uVar11;
        goto LAB_00135484;
      }
      uVar15 = (ulong)uVar11;
      goto LAB_001353ac;
    }
    if (uVar21 != 0) goto LAB_00135366;
LAB_001353bb:
    iVar17 = 0;
  }
LAB_001353c7:
  uVar21 = (ulong)(uint)(iVar13 + iVar17);
LAB_001353ed:
  dVar23._8_8_ = uVar21;
  dVar23.significand = uVar19;
  return dVar23;
}

Assistant:

decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}